

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_generation_test.cpp
# Opt level: O2

void generateChessTexture
               (PatternGeneration *pattern_generation,uint *resolution,uint *i,string *textures_dir,
               string *scripts_dir)

{
  Scalar_ *pSVar1;
  char cVar2;
  uint uVar3;
  ostream *poVar4;
  undefined1 local_28b8 [8];
  mt19937 mt;
  random_device rd;
  Mat chess_board;
  _InputArray local_148;
  undefined1 local_130 [8];
  Scalar chess_color_1;
  undefined1 local_110 [8];
  Scalar chess_color_2;
  param_type local_f0;
  uniform_int_distribution<int> dist;
  string local_c8;
  _Vector_base<int,_std::allocator<int>_> local_a8;
  undefined1 local_88 [8];
  string material_name;
  string img_name;
  string img_filename;
  
  local_88 = (undefined1  [8])&material_name._M_string_length;
  material_name._M_dataplus._M_p = (pointer)0x0;
  material_name.field_2._8_8_ = &img_name._M_string_length;
  img_name._M_dataplus._M_p = (pointer)0x0;
  img_name.field_2._8_8_ = &img_filename._M_string_length;
  img_filename._M_dataplus._M_p = (pointer)0x0;
  material_name._M_string_length._0_1_ = 0;
  img_name._M_string_length._0_1_ = 0;
  img_filename._M_string_length._0_1_ = 0;
  genNames("chess_",*i,textures_dir,(string *)local_88,(string *)((long)&material_name.field_2 + 8),
           (string *)((long)&img_name.field_2 + 8));
  std::__cxx11::string::string((string *)&dist,(string *)local_88);
  std::__cxx11::string::string
            ((string *)&local_c8,(string *)(material_name.field_2._M_local_buf + 8));
  genScript((string *)&dist,&local_c8,scripts_dir);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&dist);
  std::random_device::random_device((random_device *)&mt._M_p);
  uVar3 = std::random_device::_M_getval();
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          *)local_28b8,(ulong)uVar3);
  local_f0._M_a = 0;
  local_f0._M_b = 0x7fffffff;
  std::uniform_int_distribution<int>::operator()
            ((uniform_int_distribution<int> *)&local_f0,
             (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)local_28b8);
  PatternGeneration::getRandomColor();
  PatternGeneration::getRandomColor();
  pSVar1 = (Scalar_ *)((long)&rd.field_0 + 0x1380);
  PatternGeneration::getChessTexture
            (pSVar1,(Scalar_ *)pattern_generation,(int)local_130,(int)local_110);
  local_148.sz.width = 0;
  local_148.sz.height = 0;
  local_148.flags = 0x1010000;
  local_a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_148.obj = pSVar1;
  cVar2 = cv::imwrite((string *)(img_name.field_2._M_local_buf + 8),&local_148,(vector *)&local_a8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_a8);
  if (cVar2 != '\0') {
    cv::Mat::~Mat((Mat *)((long)&rd.field_0 + 0x1380));
    std::random_device::~random_device((random_device *)&mt._M_p);
    std::__cxx11::string::~string((string *)(img_name.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(material_name.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_88);
    return;
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"[ERROR] Could not save ");
  poVar4 = std::operator<<(poVar4,(string *)(img_name.field_2._M_local_buf + 8));
  poVar4 = std::operator<<(poVar4,". Please ensure the destination folder exists!");
  std::endl<char,std::char_traits<char>>(poVar4);
  exit(1);
}

Assistant:

void generateChessTexture(PatternGeneration & pattern_generation,
    unsigned int & resolution,
    const unsigned int & i,
    std::string & textures_dir,
    std::string & scripts_dir)
{
    std::string material_name, img_name, img_filename;
    genNames("chess_", i, textures_dir, material_name, img_name, img_filename);
    genScript(material_name, img_name, scripts_dir);
    if (!GENERATE_IMG) return;

    /* Initialize random device */
    std::random_device rd;
    std::mt19937 mt(rd());
    std::uniform_int_distribution<int> dist;
    int squares;
    int block_size;
    /* Generate square texture */
    squares = dist(mt) % 20 + 8;     // v2 in the range 1 to 100
    block_size = resolution / squares;
    if (block_size % 2 == 0)
        block_size++;

    cv::Scalar chess_color_1    = pattern_generation.getRandomColor();
    cv::Scalar chess_color_2    = pattern_generation.getRandomColor();

    cv::Mat chess_board = pattern_generation.getChessTexture(chess_color_1, chess_color_2, block_size, squares);

    // Convert to HSV
    //cv::applyColorMap(chess_board, chess_board, cv::COLORMAP_LAB);

    if (!cv::imwrite(img_filename, chess_board)){
        std::cout << "[ERROR] Could not save " << img_filename <<
        ". Please ensure the destination folder exists!" << std::endl;
        exit(EXIT_FAILURE);
    }

    if (SHOW_IMGS)
        cv::imshow("Chess board", chess_board);

}